

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

unique_ptr<Catch::MultiReporter>
Catch::Detail::make_unique<Catch::MultiReporter,Catch::Config_const*&>(Config **args)

{
  MultiReporter *ptr;
  MultiReporter *in_RDI;
  MultiReporter *this;
  
  this = in_RDI;
  ptr = (MultiReporter *)operator_new(0x40);
  MultiReporter::IEventListener(this,(IConfig *)in_RDI);
  unique_ptr<Catch::MultiReporter>::unique_ptr((unique_ptr<Catch::MultiReporter> *)in_RDI,ptr);
  return (unique_ptr<Catch::MultiReporter>)this;
}

Assistant:

unique_ptr<T> make_unique(Args&&... args) {
        return unique_ptr<T>(new T(CATCH_FORWARD(args)...));
    }